

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectileMotion.cpp
# Opt level: O2

double calculateGravity(vector<BoxPoint,_std::allocator<BoxPoint>_> *points)

{
  reference pvVar1;
  long lVar2;
  pointer pdVar3;
  ulong __n;
  undefined1 auVar4 [16];
  double dVar5;
  vector<double,_std::allocator<double>_> gravities;
  _Vector_base<double,_std::allocator<double>_> local_48;
  double local_30;
  double local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&local_48,
             ((long)(points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 5) - 2);
  for (__n = 0; __n < ((long)(points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(points->super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 5) - 2U; __n = __n + 1) {
    pvVar1 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at(points,__n);
    dVar5 = pvVar1->z;
    pvVar1 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at(points,__n + 1);
    local_30 = pvVar1->z;
    pvVar1 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at(points,__n + 2);
    local_28 = (pvVar1->z - local_30) - (local_30 - dVar5);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_48,&local_28);
  }
  dVar5 = 0.0;
  for (pdVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
      pdVar3 != local_48._M_impl.super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    dVar5 = dVar5 + *pdVar3;
  }
  lVar2 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3;
  auVar4._8_4_ = (int)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48._M_impl.super__Vector_impl_data._M_start >> 0x23);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return dVar5 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
}

Assistant:

double calculateGravity(std::vector<BoxPoint> points){
    // estimates acceleration of gravityusing the trajectory of the given points
    std::vector<double> gravities;
    gravities.reserve(points.size() - 2);
    for(size_t i=0; i<points.size()-2; i++){
        BoxPoint cur = points.at(i);
        BoxPoint next = points.at(i+1);
        BoxPoint last = points.at(i+2);

        // find v2, v1, g = v2-v1/deltat, deltat=1
        double v1 = next.z - cur.z;
        double v2 = last.z - next.z;
        gravities.emplace_back(v2-v1);

    }
    return std::accumulate(gravities.begin(), gravities.end(), 0.0)/gravities.size();
}